

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O0

void test_qclab_qgates_SWAP<std::complex<double>>(void)

{
  allocator<std::complex<double>_> *paVar1;
  complex<double> m02;
  complex<double> m02_00;
  complex<double> m03;
  complex<double> m03_00;
  complex<double> m10;
  complex<double> m10_00;
  complex<double> m11;
  complex<double> m11_00;
  complex<double> m12;
  complex<double> m12_00;
  complex<double> m13;
  complex<double> m13_00;
  complex<double> m20;
  complex<double> m20_00;
  complex<double> m21;
  complex<double> m21_00;
  complex<double> m22;
  complex<double> m22_00;
  complex<double> m23;
  complex<double> m23_00;
  complex<double> m30;
  complex<double> m30_00;
  complex<double> m31;
  complex<double> m31_00;
  complex<double> m32;
  complex<double> m32_00;
  complex<double> m33;
  complex<double> m33_00;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<std::complex<double>_> __l_02;
  initializer_list<std::complex<double>_> __l_03;
  initializer_list<std::complex<double>_> __l_04;
  initializer_list<std::complex<double>_> __l_05;
  initializer_list<std::complex<double>_> __l_06;
  initializer_list<std::complex<double>_> __l_07;
  initializer_list<std::complex<double>_> __l_08;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  int *rhs;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar5;
  complex<double> *pcVar6;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Message *message;
  char *in_R9;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m01;
  complex<double> m01_00;
  undefined7 in_stack_ffffffffffffe6e8;
  undefined1 in_stack_ffffffffffffe6ef;
  undefined8 in_stack_ffffffffffffe6f0;
  undefined8 in_stack_ffffffffffffe6f8;
  undefined8 in_stack_ffffffffffffe700;
  string local_1780;
  AssertHelper local_1760;
  Message local_1758;
  bool local_1749;
  undefined1 local_1748 [8];
  AssertionResult gtest_ar__21;
  SquareMatrix<std::complex<double>_> mat3_1;
  SquareMatrix<std::complex<double>_> check;
  SWAP<std::complex<double>_> swap_6;
  AssertHelper local_16e8;
  Message local_16e0;
  SquareMatrix<std::complex<double>_> local_16d8;
  SquareMatrix<std::complex<double>_> local_16c8;
  bool local_16b1;
  undefined1 local_16b0 [8];
  AssertionResult gtest_ar__20;
  int qnew_2 [2];
  AssertHelper local_1678;
  Message local_1670;
  SquareMatrix<std::complex<double>_> local_1668;
  SquareMatrix<std::complex<double>_> local_1658;
  bool local_1641;
  undefined1 local_1640 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<std::complex<double>_> mat3;
  AssertHelper local_1600;
  Message local_15f8;
  SquareMatrix<std::complex<double>_> local_15f0;
  SquareMatrix<std::complex<double>_> local_15e0;
  bool local_15c9;
  undefined1 local_15c8 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_1598;
  Message local_1590;
  SquareMatrix<std::complex<double>_> local_1588;
  SquareMatrix<std::complex<double>_> local_1578;
  SquareMatrix<std::complex<double>_> local_1568;
  bool local_1551;
  undefined1 local_1550 [8];
  AssertionResult gtest_ar__17;
  undefined8 uStack_1538;
  complex<double> local_1530;
  complex<double> local_1520;
  complex<double> local_1510;
  complex<double> local_1500;
  complex<double> local_14f0;
  complex<double> local_14e0;
  complex<double> local_14d0;
  complex<double> local_14c0;
  complex<double> local_14b0;
  complex<double> local_14a0;
  complex<double> local_1490;
  complex<double> local_1480;
  complex<double> local_1470;
  complex<double> local_1460;
  complex<double> local_1450;
  undefined1 local_1440 [8];
  SquareMatrix<std::complex<double>_> mat;
  AssertHelper local_1410;
  Message local_1408;
  SquareMatrix<std::complex<double>_> local_1400;
  undefined1 local_13e9 [9];
  AssertionResult gtest_ar__16;
  SquareMatrix<std::complex<double>_> mat2;
  SWAP<std::complex<double>_> swap_5;
  AssertHelper local_1398;
  Message local_1390;
  bool local_1381;
  undefined1 local_1380 [8];
  AssertionResult gtest_ar__15;
  complex<double> local_1368;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  iterator local_12e0;
  size_type local_12d8;
  undefined1 local_12d0 [8];
  V check3_1;
  V vec3_1;
  SWAP<std::complex<double>_> swap_4;
  AssertHelper local_1270;
  Message local_1268;
  bool local_1259;
  undefined1 local_1258 [8];
  AssertionResult gtest_ar__14;
  string local_1138;
  AssertHelper local_1118;
  Message local_1110;
  bool local_1101;
  undefined1 local_1100 [8];
  AssertionResult gtest_ar__13;
  string local_fe0;
  AssertHelper local_fc0;
  Message local_fb8;
  bool local_fa9;
  undefined1 local_fa8 [8];
  AssertionResult gtest_ar__12;
  complex<double> local_f90 [16];
  iterator local_e90;
  size_type local_e88;
  undefined1 local_e80 [8];
  V check4;
  V vec4;
  AssertHelper local_e30;
  Message local_e28;
  bool local_e19;
  undefined1 local_e18 [8];
  AssertionResult gtest_ar__11;
  int local_d70 [2];
  int qnew_1 [2];
  AssertHelper local_d48;
  Message local_d40;
  bool local_d31;
  undefined1 local_d30 [8];
  AssertionResult gtest_ar__10;
  complex<double> local_d18;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  iterator local_c98;
  size_type local_c90;
  undefined1 local_c88 [8];
  V check3;
  V vec3;
  AssertHelper local_c38;
  Message local_c30;
  bool local_c21;
  undefined1 local_c20 [8];
  AssertionResult gtest_ar__9;
  complex<double> local_c08;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  iterator local_bc0;
  size_type local_bb8;
  undefined1 local_bb0 [8];
  V check2;
  V vec2;
  SWAP<std::complex<double>_> swap_3;
  Message local_b68;
  int local_b5c;
  vector<int,_std::allocator<int>_> local_b58;
  undefined1 local_b40 [8];
  AssertionResult gtest_ar_14;
  Message local_b28;
  int local_b1c;
  vector<int,_std::allocator<int>_> local_b18;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_ad0;
  Message local_ac8;
  bool local_ab9;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_a88;
  Message local_a80;
  bool local_a71;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar__7;
  Message local_a58;
  int local_a50;
  int local_a4c;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar_12;
  SWAP<std::complex<double>_> swap_2;
  int qubits_1 [2];
  Message local_a18;
  int local_a0c;
  vector<int,_std::allocator<int>_> local_a08;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar_11;
  Message local_9d8;
  int local_9cc;
  vector<int,_std::allocator<int>_> local_9c8;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_980;
  Message local_978;
  bool local_969;
  undefined1 local_968 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_938;
  Message local_930;
  bool local_921;
  undefined1 local_920 [8];
  AssertionResult gtest_ar__5;
  Message local_908;
  int local_900;
  int local_8fc;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar_9;
  SWAP<std::complex<double>_> swap_1;
  AssertHelper local_8b8;
  Message local_8b0;
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_870;
  Message local_868;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__3;
  SWAP<std::complex<double>_> swap2;
  AssertHelper local_818;
  Message local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_8;
  Message local_7d0;
  int local_7c8;
  int local_7c4;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_7;
  stringstream qasm;
  ostream local_7a0 [376];
  string local_628;
  AssertHelper local_608;
  Message local_600;
  SquareMatrix<std::complex<double>_> local_5f8;
  bool local_5e1;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar__2;
  undefined8 uStack_5c8;
  complex<double> local_5c0;
  complex<double> local_5b0;
  complex<double> local_5a0;
  complex<double> local_590;
  complex<double> local_580;
  complex<double> local_570;
  complex<double> local_560;
  complex<double> local_550;
  complex<double> local_540;
  complex<double> local_530;
  complex<double> local_520;
  complex<double> local_510;
  complex<double> local_500;
  complex<double> local_4f0;
  complex<double> local_4e0;
  undefined1 local_4d0 [8];
  SquareMatrix<std::complex<double>_> SWAP_check;
  Message local_4b8;
  int local_4ac;
  vector<int,_std::allocator<int>_> local_4a8;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_6;
  Message local_478;
  int local_46c;
  vector<int,_std::allocator<int>_> local_468;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_5;
  int qnew [2];
  Message local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_4;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_3;
  Message local_3e0;
  int local_3d4;
  size_type local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_2;
  vector<int,_std::allocator<int>_> qubits;
  Message local_398;
  int local_390;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_358;
  Message local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_310;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_;
  Message local_2e0;
  int local_2d8;
  int local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar;
  SWAP<std::complex<double>_> swap;
  complex<double> local_2a8 [16];
  iterator local_1a8;
  size_type local_1a0;
  undefined1 local_198 [8];
  V v4;
  complex<double> local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  V v3;
  complex<double> local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  V v2;
  SquareMatrix<std::complex<double>_> I4;
  SquareMatrix<std::complex<double>_> I3;
  undefined1 local_28 [8];
  SquareMatrix<std::complex<double>_> I2;
  SquareMatrix<std::complex<double>_> I1;
  
  qclab::dense::eye<std::complex<double>>((int64_t)&I2.data_);
  qclab::dense::eye<std::complex<double>>((int64_t)local_28);
  qclab::dense::eye<std::complex<double>>((int64_t)&I4.data_);
  qclab::dense::eye<std::complex<double>>
            ((int64_t)&v2.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_98 = 0x401c000000000000;
  uStack_90 = 0;
  local_a8 = 0x4000000000000000;
  uStack_a0 = 0;
  local_b8 = 0x4014000000000000;
  uStack_b0 = 0;
  local_c8._M_value._0_8_ = 0x4008000000000000;
  local_c8._M_value._8_8_ = 0;
  local_80 = &local_c8;
  local_78 = 4;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&v3.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_08._M_len = local_78;
  __l_08._M_array = local_80;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_70,__l_08
             ,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&v3.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_108 = 0x4008000000000000;
  uStack_100 = 0;
  local_118 = 0x4020000000000000;
  uStack_110 = 0;
  local_128 = 0x3ff0000000000000;
  uStack_120 = 0;
  local_138 = 0x4010000000000000;
  uStack_130 = 0;
  local_148 = 0x401c000000000000;
  uStack_140 = 0;
  local_158 = 0x4000000000000000;
  uStack_150 = 0;
  local_168 = 0x4014000000000000;
  uStack_160 = 0;
  local_178._M_value._0_8_ = 0x4008000000000000;
  local_178._M_value._8_8_ = 0;
  local_f8 = &local_178;
  local_f0 = 8;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&v4.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_07._M_len = local_f0;
  __l_07._M_array = local_f8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8,__l_07
             ,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&v4.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  memcpy(local_2a8,&DAT_00692850,0x100);
  local_1a0 = 0x10;
  paVar1 = (allocator<std::complex<double>_> *)((long)swap.qubits_._M_elems + 7);
  local_1a8 = local_2a8;
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_06._M_len = local_1a0;
  __l_06._M_array = local_1a8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198,
             __l_06,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)((long)swap.qubits_._M_elems + 7));
  qclab::qgates::SWAP<std::complex<double>_>::SWAP
            ((SWAP<std::complex<double>_> *)&gtest_ar.message_);
  local_2d4 = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                        ((QGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_2d8 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2d0,"swap.nbQubits()","2",&local_2d4,&local_2d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_2f9 = qclab::qgates::SWAP<std::complex<double>_>::fixed
                        ((SWAP<std::complex<double>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_2f8,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  bVar2 = qclab::qgates::SWAP<std::complex<double>_>::controlled
                    ((SWAP<std::complex<double>_> *)&gtest_ar.message_);
  local_341 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_340,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_38c = qclab::qgates::SWAP<std::complex<double>_>::qubit
                        ((SWAP<std::complex<double>_> *)&gtest_ar.message_);
  local_390 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_388,"swap.qubit()","0",&local_38c,&local_390);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_398);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  qclab::qgates::SWAP<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,
             (SWAP<std::complex<double>_> *)&gtest_ar.message_);
  local_3d0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  local_3d4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3c8,"qubits.size()","2",&local_3d0,&local_3d4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,0);
  local_3fc = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3f8,"qubits[0]","0",pvVar4,&local_3fc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar2) {
    testing::Message::Message(&local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,1);
  local_424 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_420,"qubits[1]","1",pvVar4,&local_424);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar2) {
    testing::Message::Message(&local_430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x500000003;
  qclab::qgates::SWAP<std::complex<double>_>::setQubits
            ((SWAP<std::complex<double>_> *)&gtest_ar.message_,(int *)&gtest_ar_5.message_);
  qclab::qgates::SWAP<std::complex<double>_>::qubits
            (&local_468,(SWAP<std::complex<double>_> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_468,0);
  local_46c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_450,"swap.qubits()[0]","3",pvVar4,&local_46c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_468);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar2) {
    testing::Message::Message(&local_478);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  qclab::qgates::SWAP<std::complex<double>_>::qubits
            (&local_4a8,(SWAP<std::complex<double>_> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_4a8,1);
  local_4ac = 5;
  rhs = &local_4ac;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_490,"swap.qubits()[1]","5",pvVar4,rhs);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar2) {
    testing::Message::Message(&local_4b8);
    rhs = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_490);
    pvVar4 = (reference)0x24;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x24,(char *)rhs);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check.data_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check.data_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  puVar5 = &gtest_ar_5.message_;
  qclab::qgates::SWAP<std::complex<double>_>::setQubits
            ((SWAP<std::complex<double>_> *)&gtest_ar.message_,(int *)puVar5);
  std::complex<double>::complex(&local_4e0,1.0,0.0);
  std::complex<double>::complex(&local_4f0,0.0,0.0);
  std::complex<double>::complex(&local_500,0.0,0.0);
  std::complex<double>::complex(&local_510,0.0,0.0);
  std::complex<double>::complex(&local_520,0.0,0.0);
  std::complex<double>::complex(&local_530,0.0,0.0);
  std::complex<double>::complex(&local_540,1.0,0.0);
  std::complex<double>::complex(&local_550,0.0,0.0);
  std::complex<double>::complex(&local_560,0.0,0.0);
  std::complex<double>::complex(&local_570,1.0,0.0);
  std::complex<double>::complex(&local_580,0.0,0.0);
  std::complex<double>::complex(&local_590,0.0,0.0);
  std::complex<double>::complex(&local_5a0,0.0,0.0);
  std::complex<double>::complex(&local_5b0,0.0,0.0);
  std::complex<double>::complex(&local_5c0,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__2.message_,1.0,0.0);
  m02._M_value._8_8_ = local_520._M_value._8_8_;
  m02._M_value._0_8_ = local_520._M_value._0_8_;
  m03._M_value._8_8_ = local_530._M_value._8_8_;
  m03._M_value._0_8_ = local_530._M_value._0_8_;
  m10._M_value._8_8_ = local_540._M_value._8_8_;
  m10._M_value._0_8_ = local_540._M_value._0_8_;
  m11._M_value._8_8_ = local_550._M_value._8_8_;
  m11._M_value._0_8_ = local_550._M_value._0_8_;
  m12._M_value._8_8_ = local_560._M_value._8_8_;
  m12._M_value._0_8_ = local_560._M_value._0_8_;
  m13._M_value._8_8_ = local_570._M_value._8_8_;
  m13._M_value._0_8_ = local_570._M_value._0_8_;
  m20._M_value._8_8_ = local_580._M_value._8_8_;
  m20._M_value._0_8_ = local_580._M_value._0_8_;
  m21._M_value._8_8_ = local_590._M_value._8_8_;
  m21._M_value._0_8_ = local_590._M_value._0_8_;
  m22._M_value._8_8_ = local_5a0._M_value._8_8_;
  m22._M_value._0_8_ = local_5a0._M_value._0_8_;
  m23._M_value._8_8_ = local_5b0._M_value._8_8_;
  m23._M_value._0_8_ = local_5b0._M_value._0_8_;
  m30._M_value._8_8_ = local_5c0._M_value._8_8_;
  m30._M_value._0_8_ = local_5c0._M_value._0_8_;
  m31._M_value._8_8_ = uStack_5c8;
  m31._M_value._0_8_ =
       gtest_ar__2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32._M_value[7] = in_stack_ffffffffffffe6ef;
  m32._M_value._0_7_ = in_stack_ffffffffffffe6e8;
  m32._M_value._8_8_ = in_stack_ffffffffffffe6f0;
  m33._M_value._8_8_ = in_stack_ffffffffffffe700;
  m33._M_value._0_8_ = in_stack_ffffffffffffe6f8;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = puVar5;
  m01._M_value._8_8_ = rhs;
  m01._M_value._0_8_ = pvVar4;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_4d0,m00,m01,m02,m03,m10,m11,m12,m13,m20,
             m21,m22,m23,m30,m31,m32,m33);
  qclab::qgates::SWAP<std::complex<double>_>::matrix((SWAP<std::complex<double>_> *)&local_5f8);
  local_5e1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        (&local_5f8,(SquareMatrix<std::complex<double>_> *)local_4d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5e0,&local_5e1,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_5f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar2) {
    testing::Message::Message(&local_600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_628,(internal *)local_5e0,(AssertionResult *)"swap.matrix() == SWAP_check",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  qclab::qgates::QGate2<std::complex<double>_>::print
            ((QGate2<std::complex<double>_> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_7.message_);
  local_7c4 = qclab::qgates::SWAP<std::complex<double>_>::toQASM
                        ((SWAP<std::complex<double>_> *)&gtest_ar.message_,local_7a0,0);
  local_7c8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7c0,"swap.toQASM( qasm )","0",&local_7c4,&local_7c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar2) {
    testing::Message::Message(&local_7d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_7e8,"qasm.str()","\"swap q[0], q[1];\\n\"",&local_808,
             (char (*) [18])0x6930df);
  std::__cxx11::string::~string((string *)&local_808);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar2) {
    testing::Message::Message(&local_810);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x36,pcVar3);
    testing::internal::AssertHelper::operator=(&local_818,&local_810);
    testing::internal::AssertHelper::~AssertHelper(&local_818);
    testing::Message::~Message(&local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&swap2.qubits_);
  std::__cxx11::string::~string((string *)&swap2.qubits_);
  qclab::qgates::SWAP<std::complex<double>_>::SWAP
            ((SWAP<std::complex<double>_> *)&gtest_ar__3.message_,2,4);
  local_859 = qclab::QObject<std::complex<double>_>::operator==
                        ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                         (QObject<std::complex<double>_> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_858,&local_859,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar2) {
    testing::Message::Message(&local_868);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_858,
               (AssertionResult *)"swap == swap2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_870,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_870,&local_868);
    testing::internal::AssertHelper::~AssertHelper(&local_870);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  bVar2 = qclab::QObject<std::complex<double>_>::operator!=
                    ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                     (QObject<std::complex<double>_> *)&gtest_ar__3.message_);
  local_8a1 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a0,&local_8a1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar2) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_1.qubits_,(internal *)local_8a0,(AssertionResult *)"swap != swap2",
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&swap_1.qubits_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  qclab::qgates::SWAP<std::complex<double>_>::~SWAP
            ((SWAP<std::complex<double>_> *)&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_4d0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  qclab::qgates::SWAP<std::complex<double>_>::~SWAP
            ((SWAP<std::complex<double>_> *)&gtest_ar.message_);
  qclab::qgates::SWAP<std::complex<double>_>::SWAP
            ((SWAP<std::complex<double>_> *)&gtest_ar_9.message_,3,5);
  local_8fc = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                        ((QGate2<std::complex<double>_> *)&gtest_ar_9.message_);
  local_900 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_8f8,"swap.nbQubits()","2",&local_8fc,&local_900);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar2) {
    testing::Message::Message(&local_908);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  local_921 = qclab::qgates::SWAP<std::complex<double>_>::fixed
                        ((SWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_920,&local_921,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
  if (!bVar2) {
    testing::Message::Message(&local_930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_920,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_938,&local_930);
    testing::internal::AssertHelper::~AssertHelper(&local_938);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
  bVar2 = qclab::qgates::SWAP<std::complex<double>_>::controlled
                    ((SWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  local_969 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_968,&local_969,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_968);
  if (!bVar2) {
    testing::Message::Message(&local_978);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_968,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=(&local_980,&local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_968);
  qclab::qgates::SWAP<std::complex<double>_>::qubits
            (&local_9c8,(SWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_9c8,0);
  local_9cc = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9b0,"swap.qubits()[0]","3",pvVar4,&local_9cc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_9c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar2) {
    testing::Message::Message(&local_9d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  qclab::qgates::SWAP<std::complex<double>_>::qubits
            (&local_a08,(SWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_a08,1);
  local_a0c = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9f0,"swap.qubits()[1]","5",pvVar4,&local_a0c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a08);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
  if (!bVar2) {
    testing::Message::Message(&local_a18);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qubits_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qubits_1,&local_a18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qubits_1);
    testing::Message::~Message(&local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
  qclab::qgates::SWAP<std::complex<double>_>::~SWAP
            ((SWAP<std::complex<double>_> *)&gtest_ar_9.message_);
  swap_2.qubits_._M_elems[0] = 3;
  swap_2.qubits_._M_elems[1] = 5;
  qclab::qgates::SWAP<std::complex<double>_>::SWAP
            ((SWAP<std::complex<double>_> *)&gtest_ar_12.message_,swap_2.qubits_._M_elems);
  local_a4c = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                        ((QGate2<std::complex<double>_> *)&gtest_ar_12.message_);
  local_a50 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a48,"swap.nbQubits()","2",&local_a4c,&local_a50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
  if (!bVar2) {
    testing::Message::Message(&local_a58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_a58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
  local_a71 = qclab::qgates::SWAP<std::complex<double>_>::fixed
                        ((SWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a70,&local_a71,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar2) {
    testing::Message::Message(&local_a80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_a70,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a88,&local_a80);
    testing::internal::AssertHelper::~AssertHelper(&local_a88);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  bVar2 = qclab::qgates::SWAP<std::complex<double>_>::controlled
                    ((SWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  local_ab9 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ab8,&local_ab9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar2) {
    testing::Message::Message(&local_ac8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_ab8,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ad0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ad0,&local_ac8);
    testing::internal::AssertHelper::~AssertHelper(&local_ad0);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  qclab::qgates::SWAP<std::complex<double>_>::qubits
            (&local_b18,(SWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_b18,0);
  local_b1c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b00,"swap.qubits()[0]","3",pvVar4,&local_b1c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b18);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b00);
  if (!bVar2) {
    testing::Message::Message(&local_b28);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_b28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_b28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00);
  qclab::qgates::SWAP<std::complex<double>_>::qubits
            (&local_b58,(SWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_b58,1);
  local_b5c = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b40,"swap.qubits()[1]","5",pvVar4,&local_b5c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b58);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b40);
  if (!bVar2) {
    testing::Message::Message(&local_b68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap_3.qubits_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap_3.qubits_,&local_b68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap_3.qubits_);
    testing::Message::~Message(&local_b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b40);
  qclab::qgates::SWAP<std::complex<double>_>::~SWAP
            ((SWAP<std::complex<double>_> *)&gtest_ar_12.message_);
  qclab::qgates::SWAP<std::complex<double>_>::SWAP
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_70);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_bd8 = 0x401c000000000000;
  uStack_bd0 = 0;
  local_be8 = 0x4014000000000000;
  uStack_be0 = 0;
  local_bf8 = 0x4000000000000000;
  uStack_bf0 = 0;
  local_c08._M_value._0_8_ = 0x4008000000000000;
  local_c08._M_value._8_8_ = 0;
  local_bc0 = &local_c08;
  local_bb8 = 4;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&gtest_ar__9.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_05._M_len = local_bb8;
  __l_05._M_array = local_bc0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_bb0,
             __l_05,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_c21 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check2.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_bb0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c20,&local_c21,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c20);
  if (!bVar2) {
    testing::Message::Message(&local_c30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_c20,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c38,&local_c30);
    testing::internal::AssertHelper::~AssertHelper(&local_c38);
    std::__cxx11::string::~string
              ((string *)
               &vec3.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_c30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c20);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_ca8 = 0x4008000000000000;
  uStack_ca0 = 0;
  local_cb8 = 0x4020000000000000;
  uStack_cb0 = 0;
  local_cc8 = 0x401c000000000000;
  uStack_cc0 = 0;
  local_cd8 = 0x4000000000000000;
  uStack_cd0 = 0;
  local_ce8 = 0x3ff0000000000000;
  uStack_ce0 = 0;
  local_cf8 = 0x4010000000000000;
  uStack_cf0 = 0;
  local_d08 = 0x4014000000000000;
  uStack_d00 = 0;
  local_d18._M_value._0_8_ = 0x4008000000000000;
  local_d18._M_value._8_8_ = 0;
  local_c98 = &local_d18;
  local_c90 = 8;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&gtest_ar__10.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_04._M_len = local_c90;
  __l_04._M_array = local_c98;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_c88,
             __l_04,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__10.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_d31 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check3.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_c88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d30,&local_d31,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d30);
  if (!bVar2) {
    testing::Message::Message(&local_d40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)qnew_1,(internal *)local_d30,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d48,&local_d40);
    testing::internal::AssertHelper::~AssertHelper(&local_d48);
    std::__cxx11::string::~string((string *)qnew_1);
    testing::Message::~Message(&local_d40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d30);
  local_d70[0] = 1;
  local_d70[1] = 2;
  qclab::qgates::SWAP<std::complex<double>_>::setQubits
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_d70);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  __l_03._M_len = 8;
  __l_03._M_array = (iterator)&gtest_ar__11.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_c88,
             __l_03);
  local_e19 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check3.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_c88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e18,&local_e19,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e18);
  if (!bVar2) {
    testing::Message::Message(&local_e28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec4.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_e18,
               (AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e30,&local_e28);
    testing::internal::AssertHelper::~AssertHelper(&local_e30);
    std::__cxx11::string::~string
              ((string *)
               &vec4.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_e28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e18);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(local_f90,&DAT_00692a90,0x100);
  local_e88 = 0x10;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&gtest_ar__12.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  local_e90 = local_f90;
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_02._M_len = local_e88;
  __l_02._M_array = local_e90;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e80,
             __l_02,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__12.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_fa9 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check4.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_e80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fa8,&local_fa9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa8);
  if (!bVar2) {
    testing::Message::Message(&local_fb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fe0,(internal *)local_fa8,(AssertionResult *)"vec4 == check4","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_fc0,&local_fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
    std::__cxx11::string::~string((string *)&local_fe0);
    testing::Message::~Message(&local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa8);
  local_d70[0] = 0;
  local_d70[1] = 1;
  qclab::qgates::SWAP<std::complex<double>_>::setQubits
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_d70);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(&gtest_ar__13.message_,&DAT_00692b90,0x100);
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&gtest_ar__13.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e80,
             __l_01);
  local_1101 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)&check4.
                                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)local_e80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1100,&local_1101,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1100);
  if (!bVar2) {
    testing::Message::Message(&local_1110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1138,(internal *)local_1100,(AssertionResult *)"vec4 == check4","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1118,&local_1110);
    testing::internal::AssertHelper::~AssertHelper(&local_1118);
    std::__cxx11::string::~string((string *)&local_1138);
    testing::Message::~Message(&local_1110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1100);
  local_d70[0] = 2;
  local_d70[1] = 3;
  qclab::qgates::SWAP<std::complex<double>_>::setQubits
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_d70);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  memcpy(&gtest_ar__14.message_,&DAT_00692c90,0x100);
  __l_00._M_len = 0x10;
  __l_00._M_array = (iterator)&gtest_ar__14.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e80,
             __l_00);
  local_1259 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)&check4.
                                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)local_e80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1258,&local_1259,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1258);
  if (!bVar2) {
    testing::Message::Message(&local_1268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_4.qubits_,(internal *)local_1258,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1270,&local_1268);
    testing::internal::AssertHelper::~AssertHelper(&local_1270);
    std::__cxx11::string::~string((string *)&swap_4.qubits_);
    testing::Message::~Message(&local_1268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1258);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e80);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check4.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_c88);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_bb0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<std::complex<double>_>::~SWAP
            ((SWAP<std::complex<double>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<std::complex<double>_>::SWAP
            ((SWAP<std::complex<double>_> *)
             &vec3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,2);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)
             &vec3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_12f8 = 0x4008000000000000;
  uStack_12f0 = 0;
  local_1308 = 0x401c000000000000;
  uStack_1300 = 0;
  local_1318 = 0x3ff0000000000000;
  uStack_1310 = 0;
  local_1328 = 0x4014000000000000;
  uStack_1320 = 0;
  local_1338 = 0x4020000000000000;
  uStack_1330 = 0;
  local_1348 = 0x4000000000000000;
  uStack_1340 = 0;
  local_1358 = 0x4010000000000000;
  uStack_1350 = 0;
  local_1368._M_value._0_8_ = 0x4008000000000000;
  local_1368._M_value._8_8_ = 0;
  local_12e0 = &local_1368;
  local_12d8 = 8;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&gtest_ar__15.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l._M_len = local_12d8;
  __l._M_array = local_12e0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_12d0,__l,
             paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__15.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1381 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)&check3_1.
                                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)local_12d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1380,&local_1381,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1380);
  if (!bVar2) {
    testing::Message::Message(&local_1390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_5.qubits_,(internal *)local_1380,(AssertionResult *)"vec3 == check3",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xac,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1398,&local_1390);
    testing::internal::AssertHelper::~AssertHelper(&local_1398);
    std::__cxx11::string::~string((string *)&swap_5.qubits_);
    testing::Message::~Message(&local_1390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1380);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_12d0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<std::complex<double>_>::~SWAP
            ((SWAP<std::complex<double>_> *)
             &vec3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<std::complex<double>_>::SWAP((SWAP<std::complex<double>_> *)&mat2.data_,0,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  uVar7 = 2;
  puVar5 = &gtest_ar__16.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)puVar5,0);
  qclab::qgates::SWAP<std::complex<double>_>::matrix((SWAP<std::complex<double>_> *)&local_1400);
  local_13e9[0] =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,&local_1400);
  message = (Message *)local_13e9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_13e9 + 1),(bool *)message,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1400);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_13e9 + 1));
  if (!bVar2) {
    testing::Message::Message(&local_1408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat.data_,(internal *)(local_13e9 + 1),
               (AssertionResult *)"mat2 == swap.matrix()","false","true",pcVar3);
    puVar5 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::__cxx11::string::c_str();
    uVar7 = 0xbb;
    testing::internal::AssertHelper::AssertHelper
              (&local_1410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xbb,(char *)puVar5);
    message = &local_1408;
    testing::internal::AssertHelper::operator=(&local_1410,message);
    testing::internal::AssertHelper::~AssertHelper(&local_1410);
    std::__cxx11::string::~string((string *)&mat.data_);
    testing::Message::~Message(&local_1408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_13e9 + 1));
  std::complex<double>::complex(&local_1450,1.0,0.0);
  std::complex<double>::complex(&local_1460,2.0,0.0);
  std::complex<double>::complex(&local_1470,3.0,0.0);
  std::complex<double>::complex(&local_1480,4.0,0.0);
  std::complex<double>::complex(&local_1490,5.0,0.0);
  std::complex<double>::complex(&local_14a0,6.0,0.0);
  std::complex<double>::complex(&local_14b0,7.0,0.0);
  std::complex<double>::complex(&local_14c0,8.0,0.0);
  std::complex<double>::complex(&local_14d0,9.0,0.0);
  std::complex<double>::complex(&local_14e0,10.0,0.0);
  std::complex<double>::complex(&local_14f0,11.0,0.0);
  std::complex<double>::complex(&local_1500,12.0,0.0);
  std::complex<double>::complex(&local_1510,13.0,0.0);
  std::complex<double>::complex(&local_1520,14.0,0.0);
  std::complex<double>::complex(&local_1530,15.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__17.message_,16.0,0.0);
  m02_00._M_value._8_8_ = local_1490._M_value._8_8_;
  m02_00._M_value._0_8_ = local_1490._M_value._0_8_;
  m03_00._M_value._8_8_ = local_14a0._M_value._8_8_;
  m03_00._M_value._0_8_ = local_14a0._M_value._0_8_;
  m10_00._M_value._8_8_ = local_14b0._M_value._8_8_;
  m10_00._M_value._0_8_ = local_14b0._M_value._0_8_;
  m11_00._M_value._8_8_ = local_14c0._M_value._8_8_;
  m11_00._M_value._0_8_ = local_14c0._M_value._0_8_;
  m12_00._M_value._8_8_ = local_14d0._M_value._8_8_;
  m12_00._M_value._0_8_ = local_14d0._M_value._0_8_;
  m13_00._M_value._8_8_ = local_14e0._M_value._8_8_;
  m13_00._M_value._0_8_ = local_14e0._M_value._0_8_;
  m20_00._M_value._8_8_ = local_14f0._M_value._8_8_;
  m20_00._M_value._0_8_ = local_14f0._M_value._0_8_;
  m21_00._M_value._8_8_ = local_1500._M_value._8_8_;
  m21_00._M_value._0_8_ = local_1500._M_value._0_8_;
  m22_00._M_value._8_8_ = local_1510._M_value._8_8_;
  m22_00._M_value._0_8_ = local_1510._M_value._0_8_;
  m23_00._M_value._8_8_ = local_1520._M_value._8_8_;
  m23_00._M_value._0_8_ = local_1520._M_value._0_8_;
  m30_00._M_value._8_8_ = local_1530._M_value._8_8_;
  m30_00._M_value._0_8_ = local_1530._M_value._0_8_;
  m31_00._M_value._8_8_ = uStack_1538;
  m31_00._M_value._0_8_ =
       gtest_ar__17.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32_00._M_value[7] = in_stack_ffffffffffffe6ef;
  m32_00._M_value._0_7_ = in_stack_ffffffffffffe6e8;
  m32_00._M_value._8_8_ = in_stack_ffffffffffffe6f0;
  m33_00._M_value._8_8_ = in_stack_ffffffffffffe700;
  m33_00._M_value._0_8_ = in_stack_ffffffffffffe6f8;
  m00_00._M_value._8_8_ = extraout_RDX_00;
  m00_00._M_value._0_8_ = message;
  m01_00._M_value._8_8_ = puVar5;
  m01_00._M_value._0_8_ = uVar7;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1440,m00_00,m01_00,m02_00,m03_00,m10_00,
             m11_00,m12_00,m13_00,m20_00,m21_00,m22_00,m23_00,m30_00,m31_00,m32_00,m33_00);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,
             (SquareMatrix<std::complex<double>_> *)local_1440);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1578,(SquareMatrix<std::complex<double>_> *)local_1440);
  qclab::qgates::SWAP<std::complex<double>_>::matrix((SWAP<std::complex<double>_> *)&local_1588);
  qclab::dense::operator*((dense *)&local_1568,&local_1578,&local_1588);
  local_1551 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,&local_1568)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1550,&local_1551,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1568);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1588);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1578);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1550);
  if (!bVar2) {
    testing::Message::Message(&local_1590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_1550,
               (AssertionResult *)"mat2 == mat * swap.matrix()","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1598,&local_1590);
    testing::internal::AssertHelper::~AssertHelper(&local_1598);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_1590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1550);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,
             (SquareMatrix<std::complex<double>_> *)local_1440);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)&mat2.data_,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,0);
  qclab::qgates::SWAP<std::complex<double>_>::matrix((SWAP<std::complex<double>_> *)&local_15f0);
  qclab::dense::operator*
            ((dense *)&local_15e0,&local_15f0,(SquareMatrix<std::complex<double>_> *)local_1440);
  local_15c9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,&local_15e0)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_15c8,&local_15c9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_15e0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_15f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c8);
  if (!bVar2) {
    testing::Message::Message(&local_15f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3.data_,(internal *)local_15c8,
               (AssertionResult *)"mat2 == swap.matrix() * mat","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1600,&local_15f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1600);
    std::__cxx11::string::~string((string *)&mat3.data_);
    testing::Message::~Message(&local_15f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,0);
  qclab::qgates::SWAP<std::complex<double>_>::matrix((SWAP<std::complex<double>_> *)&local_1668);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1658,&local_1668,(SquareMatrix<std::complex<double>_> *)&I2.data_);
  local_1641 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,&local_1658)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1640,&local_1641,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1658);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1668);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1640);
  if (!bVar2) {
    testing::Message::Message(&local_1670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)qnew_2,(internal *)local_1640,
               (AssertionResult *)"mat3 == qclab::dense::kron( swap.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1678,&local_1670);
    testing::internal::AssertHelper::~AssertHelper(&local_1678);
    std::__cxx11::string::~string((string *)qnew_2);
    testing::Message::~Message(&local_1670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1640);
  gtest_ar__20.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x200000001;
  qclab::qgates::SWAP<std::complex<double>_>::setQubits
            ((SWAP<std::complex<double>_> *)&mat2.data_,(int *)&gtest_ar__20.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,0);
  qclab::qgates::SWAP<std::complex<double>_>::matrix((SWAP<std::complex<double>_> *)&local_16d8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_16c8,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_16d8);
  local_16b1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,&local_16c8)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_16b0,&local_16b1,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_16c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_16d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16b0);
  if (!bVar2) {
    testing::Message::Message(&local_16e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_6.qubits_,(internal *)local_16b0,
               (AssertionResult *)"mat3 == qclab::dense::kron( I1 , swap.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_16e8,&local_16e0);
    testing::internal::AssertHelper::~AssertHelper(&local_16e8);
    std::__cxx11::string::~string((string *)&swap_6.qubits_);
    testing::Message::~Message(&local_16e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16b0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1440);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_);
  qclab::qgates::SWAP<std::complex<double>_>::~SWAP((SWAP<std::complex<double>_> *)&mat2.data_);
  qclab::qgates::SWAP<std::complex<double>_>::SWAP((SWAP<std::complex<double>_> *)&check.data_,0,2);
  qclab::dense::zeros<std::complex<double>>((int64_t)&mat3_1.data_);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,0,0);
  std::complex<double>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,4,1);
  std::complex<double>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,2,2);
  std::complex<double>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,6,3);
  std::complex<double>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,1,4);
  std::complex<double>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,5,5);
  std::complex<double>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,3,6);
  std::complex<double>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_,7,7);
  std::complex<double>::operator=(pcVar6,1.0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__21.message_,
             (SquareMatrix<std::complex<double>_> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)&check.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__21.message_,0);
  local_1749 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__21.message_,
                          (SquareMatrix<std::complex<double>_> *)&mat3_1.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1748,&local_1749,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1748);
  if (!bVar2) {
    testing::Message::Message(&local_1758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1780,(internal *)local_1748,(AssertionResult *)"mat3 == check","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1760,&local_1758);
    testing::internal::AssertHelper::~AssertHelper(&local_1760);
    std::__cxx11::string::~string((string *)&local_1780);
    testing::Message::~Message(&local_1758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1748);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__21.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&mat3_1.data_);
  qclab::qgates::SWAP<std::complex<double>_>::~SWAP((SWAP<std::complex<double>_> *)&check.data_);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_198);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_70);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)
             &v2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&I4.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_28);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_SWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::SWAP< T >  swap ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( swap.qubit() , 0 ) ;

    // qubits
    auto qubits = swap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    swap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;

    // matrix
    qclab::dense::SquareMatrix< T >  SWAP_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( swap.matrix() == SWAP_check ) ;

    // print
    swap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( swap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "swap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::SWAP< T >  swap2( 2 , 4 ) ;
    EXPECT_TRUE(  swap == swap2 ) ;
    EXPECT_FALSE( swap != swap2 ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 3 , 5 ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::SWAP< T >  swap( &qubits[0] ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    swap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , 2 , 5 , 7 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { swap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 , 7 , 2 , 8 , 9 , 5 , 6 , 5 , 1};
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , 7 , 2 , 5 , 6 , 4 , 1 , 8 , 3 , 8 , 9 , 5 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 , 7 , 5 , 2 , 6 , 8 , 5 , 9 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 4 , 2 , 8 , 5 , 1 , 7 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == mat * swap.matrix() ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( swap.matrix() , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 , swap.matrix() ) ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = 1 ;
    check(2,2) = 1 ;
    check(6,3) = 1 ;
    check(1,4) = 1 ;
    check(5,5) = 1 ;
    check(3,6) = 1 ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == check ) ;
  }

}